

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

int32_t ggml_get_i32_nd(ggml_tensor *tensor,int i0,int i1,int i2,int i3)

{
  ggml_type gVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  pvVar2 = tensor->data;
  lVar3 = (long)i2 * tensor->nb[2] + (long)i1 * tensor->nb[1] + (long)i0 * tensor->nb[0];
  lVar4 = (long)i3 * tensor->nb[3];
  gVar1 = tensor->type;
  switch(gVar1) {
  case GGML_TYPE_I8:
    return (int)*(char *)((long)pvVar2 + lVar4 + lVar3);
  case GGML_TYPE_I16:
    return (int)*(short *)((long)pvVar2 + lVar4 + lVar3);
  case GGML_TYPE_I32:
    return *(int32_t *)((long)pvVar2 + lVar4 + lVar3);
  case GGML_TYPE_I64:
  case GGML_TYPE_F64:
  case GGML_TYPE_IQ1_M:
    goto switchD_0010ca93_caseD_1b;
  case GGML_TYPE_BF16:
    return (int)(float)((uint)*(ushort *)((long)pvVar2 + lVar4 + lVar3) << 0x10);
  default:
    if (gVar1 == GGML_TYPE_F32) {
      return (int)*(float *)((long)pvVar2 + lVar4 + lVar3);
    }
    if (gVar1 == GGML_TYPE_F16) {
      return (int)*(float *)(&ggml_table_f32_f16 +
                            (ulong)*(ushort *)((long)pvVar2 + lVar4 + lVar3) * 4);
    }
switchD_0010ca93_caseD_1b:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
               ,0x3eb,"fatal error");
  }
}

Assistant:

int32_t ggml_get_i32_nd(const struct ggml_tensor * tensor, int i0, int i1, int i2, int i3) {
    void * data   = (char *) tensor->data + i0*tensor->nb[0] + i1*tensor->nb[1] + i2*tensor->nb[2] + i3*tensor->nb[3];
    switch (tensor->type) {
        case GGML_TYPE_I8:
            return ((int8_t *) data)[0];
        case GGML_TYPE_I16:
            return ((int16_t *) data)[0];
        case GGML_TYPE_I32:
            return ((int32_t *) data)[0];
        case GGML_TYPE_F16:
            return GGML_FP16_TO_FP32(((ggml_fp16_t *) data)[0]);
        case GGML_TYPE_BF16:
            return GGML_BF16_TO_FP32(((ggml_bf16_t *) data)[0]);
        case GGML_TYPE_F32:
            return ((float *) data)[0];
        default:
            GGML_ABORT("fatal error");
    }
}